

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O2

unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> * __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::constructCFGOnly(LLVMDependenceGraphBuilder *this)

{
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *puVar1;
  LLVMDependenceGraph *pLVar2;
  char cVar3;
  
  _runPointerAnalysis(this);
  dg::LLVMDependenceGraph::build
            ((Module *)
             (this->_dg)._M_t.
             super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
             .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl,
             (LLVMPointerAnalysis *)this->_M,
             (LLVMDataDependenceAnalysis *)
             (this->_PTA)._M_t.
             super___uniq_ptr_impl<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
             ._M_t.
             super__Tuple_impl<0UL,_dg::LLVMPointerAnalysis_*,_std::default_delete<dg::LLVMPointerAnalysis>_>
             .super__Head_base<0UL,_dg::LLVMPointerAnalysis_*,_false>._M_head_impl,
             (Function *)
             (this->_DDA)._M_t.
             super___uniq_ptr_impl<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
             ._M_t.
             super__Tuple_impl<0UL,_dg::dda::LLVMDataDependenceAnalysis_*,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
             .super__Head_base<0UL,_dg::dda::LLVMDataDependenceAnalysis_*,_false>._M_head_impl);
  if ((this->_options).threads == true) {
    ControlFlowGraph::buildFunction
              ((Function *)
               (this->_controlFlowGraph)._M_t.
               super___uniq_ptr_impl<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_>._M_t.
               super__Tuple_impl<0UL,_ControlFlowGraph_*,_std::default_delete<ControlFlowGraph>_>.
               super__Head_base<0UL,_ControlFlowGraph_*,_false>._M_head_impl);
  }
  puVar1 = &this->_dg;
  if ((this->_options).verifyGraph == true) {
    cVar3 = dg::LLVMDependenceGraph::verify();
    if (cVar3 == '\0') {
      pLVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
               ._M_t.
               super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
               .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
      (puVar1->_M_t).
      super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>.
      _M_t.
      super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
      .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl =
           (LLVMDependenceGraph *)0x0;
      if (pLVar2 != (LLVMDependenceGraph *)0x0) {
        (**(code **)(*(long *)pLVar2 + 8))();
      }
    }
  }
  return puVar1;
}

Assistant:

std::unique_ptr<LLVMDependenceGraph> &&constructCFGOnly() {
        // data dependencies
        _runPointerAnalysis();

        // build the graph itself
        _dg->build(_M, _PTA.get(), _DDA.get(), _entryFunction);

        if (_options.threads) {
            _controlFlowGraph->buildFunction(_entryFunction);
        }

        // verify if the graph is built correctly
        if (_options.verifyGraph && !_dg->verify()) {
            _dg.reset();
            return std::move(_dg);
        }

        return std::move(_dg);
    }